

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O1

void __thiscall
cmArchiveWrite::cmArchiveWrite(cmArchiveWrite *this,ostream *os,Compress c,string *format)

{
  string *this_00;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  archive *paVar4;
  string source_date_epoch;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  string local_50;
  
  this->Stream = os;
  paVar4 = archive_write_new();
  this->Archive = paVar4;
  paVar4 = archive_read_disk_new();
  this->Disk = paVar4;
  this->Verbose = false;
  local_58 = &this->Format;
  local_60 = &(this->Format).field_2;
  (this->Format)._M_dataplus._M_p = (pointer)local_60;
  pcVar1 = (format->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + format->_M_string_length);
  this_00 = &this->Error;
  local_68 = &(this->Error).field_2;
  (this->Error)._M_dataplus._M_p = (pointer)local_68;
  (this->Error)._M_string_length = 0;
  (this->Error).field_2._M_local_buf[0] = '\0';
  local_70 = &(this->MTime).field_2;
  (this->MTime)._M_dataplus._M_p = (pointer)local_70;
  (this->MTime)._M_string_length = 0;
  (this->MTime).field_2._M_local_buf[0] = '\0';
  (this->Uid).IsValueSet = false;
  (this->Gid).IsValueSet = false;
  local_78 = &(this->Uname).field_2;
  (this->Uname)._M_dataplus._M_p = (pointer)local_78;
  (this->Uname)._M_string_length = 0;
  (this->Uname).field_2._M_local_buf[0] = '\0';
  (this->Gname)._M_dataplus._M_p = (pointer)&(this->Gname).field_2;
  (this->Gname)._M_string_length = 0;
  (this->Gname).field_2._M_local_buf[0] = '\0';
  (this->Permissions).IsValueSet = false;
  (this->PermissionsMask).IsValueSet = false;
  switch(c) {
  case CompressNone:
    iVar3 = archive_write_add_filter_none(this->Archive);
    if (iVar3 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4d060c);
      cm_archive_error_string_abi_cxx11_(&local_98,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_98._M_dataplus._M_p);
      goto LAB_0028e9ff;
    }
    break;
  case CompressCompress:
    iVar3 = archive_write_add_filter_compress(this->Archive);
    if (iVar3 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4d062c);
      cm_archive_error_string_abi_cxx11_(&local_98,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_98._M_dataplus._M_p);
      goto LAB_0028e9ff;
    }
    break;
  case CompressGZip:
    iVar3 = archive_write_add_filter_gzip(this->Archive);
    if (iVar3 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4d0650);
      cm_archive_error_string_abi_cxx11_(&local_98,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_98._M_dataplus._M_p);
      goto LAB_0028e9ff;
    }
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",&local_98);
    bVar2 = true;
    if ((local_98._M_string_length != 0) &&
       (iVar3 = archive_write_set_filter_option(this->Archive,"gzip","timestamp",(char *)0x0),
       iVar3 != 0)) {
      std::__cxx11::string::operator=((string *)this_00,"archive_write_set_filter_option: ");
      cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar2) {
      return;
    }
    break;
  case CompressBZip2:
    iVar3 = archive_write_add_filter_bzip2(this->Archive);
    if (iVar3 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4d069c);
      cm_archive_error_string_abi_cxx11_(&local_98,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_98._M_dataplus._M_p);
      goto LAB_0028e9ff;
    }
    break;
  case CompressLZMA:
    iVar3 = archive_write_add_filter_lzma(this->Archive);
    if (iVar3 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4d06bd);
      cm_archive_error_string_abi_cxx11_(&local_98,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_98._M_dataplus._M_p);
      goto LAB_0028e9ff;
    }
    break;
  case CompressXZ:
    iVar3 = archive_write_add_filter_xz(this->Archive);
    if (iVar3 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4d06dd);
      cm_archive_error_string_abi_cxx11_(&local_98,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_98._M_dataplus._M_p);
      goto LAB_0028e9ff;
    }
  }
  iVar3 = archive_read_disk_set_standard_lookup(this->Disk);
  if (iVar3 == 0) {
    iVar3 = archive_write_set_format_by_name(this->Archive,(format->_M_dataplus)._M_p);
    if (iVar3 == 0) {
      iVar3 = archive_write_set_bytes_in_last_block(this->Archive,1);
      if (iVar3 == 0) {
        iVar3 = archive_write_open(this->Archive,this,(undefined1 *)0x0,Callback::Write,
                                   (undefined1 *)0x0);
        if (iVar3 == 0) {
          return;
        }
        std::__cxx11::string::operator=((string *)this_00,"archive_write_open: ");
        cm_archive_error_string_abi_cxx11_(&local_98,this->Archive);
        std::__cxx11::string::_M_append((char *)this_00,(ulong)local_98._M_dataplus._M_p);
      }
      else {
        std::__cxx11::string::_M_replace
                  ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4d0746);
        cm_archive_error_string_abi_cxx11_(&local_98,this->Archive);
        std::__cxx11::string::_M_append((char *)this_00,(ulong)local_98._M_dataplus._M_p);
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4d0723);
      cm_archive_error_string_abi_cxx11_(&local_98,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_98._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4d06fb);
    cm_archive_error_string_abi_cxx11_(&local_98,this->Archive);
    std::__cxx11::string::_M_append((char *)this_00,(ulong)local_98._M_dataplus._M_p);
  }
LAB_0028e9ff:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

cmArchiveWrite::cmArchiveWrite(std::ostream& os, Compress c,
                               std::string const& format)
  : Stream(os)
  , Archive(archive_write_new())
  , Disk(archive_read_disk_new())
  , Verbose(false)
  , Format(format)
{
  switch (c) {
    case CompressNone:
      if (archive_write_add_filter_none(this->Archive) != ARCHIVE_OK) {
        this->Error = "archive_write_add_filter_none: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
      }
      break;
    case CompressCompress:
      if (archive_write_add_filter_compress(this->Archive) != ARCHIVE_OK) {
        this->Error = "archive_write_add_filter_compress: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
      }
      break;
    case CompressGZip: {
      if (archive_write_add_filter_gzip(this->Archive) != ARCHIVE_OK) {
        this->Error = "archive_write_add_filter_gzip: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
      }
      std::string source_date_epoch;
      cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
      if (!source_date_epoch.empty()) {
        // We're not able to specify an arbitrary timestamp for gzip.
        // The next best thing is to omit the timestamp entirely.
        if (archive_write_set_filter_option(this->Archive, "gzip", "timestamp",
                                            nullptr) != ARCHIVE_OK) {
          this->Error = "archive_write_set_filter_option: ";
          this->Error += cm_archive_error_string(this->Archive);
          return;
        }
      }
    } break;
    case CompressBZip2:
      if (archive_write_add_filter_bzip2(this->Archive) != ARCHIVE_OK) {
        this->Error = "archive_write_add_filter_bzip2: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
      }
      break;
    case CompressLZMA:
      if (archive_write_add_filter_lzma(this->Archive) != ARCHIVE_OK) {
        this->Error = "archive_write_add_filter_lzma: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
      }
      break;
    case CompressXZ:
      if (archive_write_add_filter_xz(this->Archive) != ARCHIVE_OK) {
        this->Error = "archive_write_add_filter_xz: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
      }
      break;
  }
#if !defined(_WIN32) || defined(__CYGWIN__)
  if (archive_read_disk_set_standard_lookup(this->Disk) != ARCHIVE_OK) {
    this->Error = "archive_read_disk_set_standard_lookup: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
  }
#endif

  if (archive_write_set_format_by_name(this->Archive, format.c_str()) !=
      ARCHIVE_OK) {
    this->Error = "archive_write_set_format_by_name: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
  }

  // do not pad the last block!!
  if (archive_write_set_bytes_in_last_block(this->Archive, 1)) {
    this->Error = "archive_write_set_bytes_in_last_block: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
  }

  if (archive_write_open(
        this->Archive, this, nullptr,
        reinterpret_cast<archive_write_callback*>(&Callback::Write),
        nullptr) != ARCHIVE_OK) {
    this->Error = "archive_write_open: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
  }
}